

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus DecodeQFPRegsRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  uint Reg;
  DecodeStatus local_4;
  
  if (in_ESI < 0x20) {
    if (QFPRegDecoderTable[in_ESI] == 0xffffffff) {
      local_4 = MCDisassembler_Fail;
    }
    else {
      MCOperand_CreateReg0(in_RDI,QFPRegDecoderTable[in_ESI]);
      local_4 = MCDisassembler_Success;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeQFPRegsRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = QFPRegDecoderTable[RegNo];
	if (Reg == ~0U)
		return MCDisassembler_Fail;

	MCOperand_CreateReg0(Inst, Reg);

	return MCDisassembler_Success;
}